

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void flatbuffers::kotlin::KotlinKMPGenerator::GenerateGetterOneLine
               (CodeWriter *writer,string *name,string *type,function<void_()> *body)

{
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"_name",&local_61);
  CodeWriter::SetValue(writer,&local_60,name);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"_type",&local_61);
  CodeWriter::SetValue(writer,&local_60,type);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"val {{_name}} : {{_type}} get() = \\",(allocator<char> *)&local_60
            );
  CodeWriter::operator+=(writer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::function<void_()>::operator()(body);
  return;
}

Assistant:

static void GenerateGetterOneLine(CodeWriter &writer, const std::string &name,
                                    const std::string &type,
                                    const std::function<void()> &body) {
    // Generates Kotlin getter for properties
    // e.g.:
    // val prop: Mytype get() = x
    writer.SetValue("_name", name);
    writer.SetValue("_type", type);
    writer += "val {{_name}} : {{_type}} get() = \\";
    body();
  }